

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O1

DOMNode * __thiscall
xercesc_4_0::DOMRangeImpl::traverseRightBoundary(DOMRangeImpl *this,DOMNode *root,int how)

{
  int iVar1;
  int iVar2;
  DOMNode *n;
  undefined4 extraout_var;
  DOMNode *pDVar3;
  undefined4 extraout_var_00;
  DOMNode *pDVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  bool isFullySelected;
  DOMNode *n_00;
  
  n = getSelectedNode(this,this->fEndContainer,(int)this->fEndOffset + -1);
  pDVar4 = this->fEndContainer;
  if (n == root) {
    pDVar4 = traverseNode(this,n,n != pDVar4,false,how);
    return pDVar4;
  }
  iVar1 = (*n->_vptr_DOMNode[5])(n);
  n_00 = (DOMNode *)CONCAT44(extraout_var,iVar1);
  pDVar3 = traverseNode(this,n_00,false,false,how);
  if (n_00 != (DOMNode *)0x0) {
    isFullySelected = n != pDVar4;
    do {
      while (n != (DOMNode *)0x0) {
        iVar1 = (*n->_vptr_DOMNode[9])(n);
        pDVar4 = traverseNode(this,n,isFullySelected,false,how);
        if (how != 3) {
          iVar2 = (*pDVar3->_vptr_DOMNode[7])(pDVar3);
          (*pDVar3->_vptr_DOMNode[0xe])(pDVar3,pDVar4,CONCAT44(extraout_var_01,iVar2));
        }
        isFullySelected = true;
        n = (DOMNode *)CONCAT44(extraout_var_00,iVar1);
      }
      if (n_00 == root) {
        return pDVar3;
      }
      iVar1 = (*n_00->_vptr_DOMNode[9])(n_00);
      n = (DOMNode *)CONCAT44(extraout_var_02,iVar1);
      iVar1 = (*n_00->_vptr_DOMNode[5])(n_00);
      n_00 = (DOMNode *)CONCAT44(extraout_var_03,iVar1);
      pDVar4 = traverseNode(this,n_00,false,false,how);
      if (how != 3) {
        (*pDVar4->_vptr_DOMNode[0x11])(pDVar4,pDVar3);
      }
      pDVar3 = pDVar4;
    } while (n_00 != (DOMNode *)0x0);
  }
  return (DOMNode *)0x0;
}

Assistant:

DOMNode* DOMRangeImpl::traverseRightBoundary( DOMNode*root, int how )
{
    DOMNode*next = getSelectedNode( fEndContainer, (int)fEndOffset-1 );
    bool isFullySelected = ( next!=fEndContainer );

    if ( next==root )
        return traverseNode( next, isFullySelected, false, how );

    DOMNode*parent = next->getParentNode();
    DOMNode*clonedParent = traverseNode( parent, false, false, how );

    while( parent!=0 )
    {
        while( next!=0 )
        {
            DOMNode* prevSibling = next->getPreviousSibling();
            DOMNode* clonedChild =
                traverseNode( next, isFullySelected, false, how );
            if ( how!=DELETE_CONTENTS )
            {
                clonedParent->insertBefore(
                    clonedChild,
                    clonedParent->getFirstChild()
                );
            }
            isFullySelected = true;
            next = prevSibling;
        }
        if ( parent==root )
            return clonedParent;

        next = parent->getPreviousSibling();
        parent = parent->getParentNode();
        DOMNode* clonedGrandParent = traverseNode( parent, false, false, how );
        if ( how!=DELETE_CONTENTS )
            clonedGrandParent->appendChild( clonedParent );
        clonedParent = clonedGrandParent;

    }

    // should never occur
    return 0;
}